

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManager.cpp
# Opt level: O3

ClassDescription * __thiscall Lodtalk::ClassTable::getClassFromIndex(ClassTable *this,size_t index)

{
  anon_union_8_4_0eb573b0_for_Oop_0 aVar1;
  
  SharedMutex::read_lock(&this->sharedMutex);
  if (index < this->size) {
    aVar1 = (anon_union_8_4_0eb573b0_for_Oop_0)
            (this->pageTable).super__Vector_base<Lodtalk::Oop_*,_std::allocator<Lodtalk::Oop_*>_>.
            _M_impl.super__Vector_impl_data._M_start[index >> 9][(uint)index & 0x1ff].field_0.
            pointer;
  }
  else {
    aVar1.pointer = (uint8_t *)&NilObject;
  }
  SharedMutex::read_unlock(&this->sharedMutex);
  return (ClassDescription *)aVar1.pointer;
}

Assistant:

ClassDescription *ClassTable::getClassFromIndex(size_t index)
{
    ReadLock<SharedMutex> l(sharedMutex);
    if(index >= size)
        return reinterpret_cast<ClassDescription*> (&NilObject);

    auto pageIndex = index / OopsPerPage;
    auto elementIndex = index % OopsPerPage;
    return reinterpret_cast<ClassDescription*> (pageTable[pageIndex][elementIndex].pointer);
}